

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

double xmlXPathCastNodeToNumber(xmlNodePtr node)

{
  xmlChar *val;
  double ret;
  xmlChar *strval;
  xmlNodePtr node_local;
  
  if (node == (xmlNodePtr)0x0) {
    node_local = (xmlNodePtr)0x7ff8000000000000;
  }
  else {
    val = xmlXPathCastNodeToString(node);
    if (val == (xmlChar *)0x0) {
      node_local = (xmlNodePtr)0x7ff8000000000000;
    }
    else {
      node_local = (xmlNodePtr)xmlXPathCastStringToNumber(val);
      (*xmlFree)(val);
    }
  }
  return (double)node_local;
}

Assistant:

double
xmlXPathCastNodeToNumber (xmlNodePtr node) {
    xmlChar *strval;
    double ret;

    if (node == NULL)
	return(NAN);
    strval = xmlXPathCastNodeToString(node);
    if (strval == NULL)
	return(NAN);
    ret = xmlXPathCastStringToNumber(strval);
    xmlFree(strval);

    return(ret);
}